

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  ZeroCopyInputStream *pZVar4;
  int *piVar5;
  LogMessage *pLVar6;
  ulong uVar7;
  long lVar8;
  string *this_00;
  LogFinisher local_c9;
  ZeroCopyInputStream *local_c8;
  string *local_c0;
  string *local_b8;
  DiskSourceTree *local_b0;
  string temp_disk_file;
  LogMessage local_88;
  string local_50;
  
  local_b0 = this;
  std::__cxx11::string::string((string *)&local_50,(string *)virtual_file);
  CanonicalizePath((string *)&local_88,&local_50);
  bVar2 = std::operator!=(virtual_file,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_88);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar2 = ContainsParentReference(virtual_file);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar2) {
      uVar7 = 0xffffffffffffffff;
      lVar8 = 0x20;
      local_c0 = disk_file;
      local_b8 = virtual_file;
      while( true ) {
        pMVar1 = (local_b0->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 1;
        if ((ulong)((long)(local_b0->mappings_).
                          super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 6) <= uVar7)
        break;
        temp_disk_file._M_dataplus._M_p = (pointer)&temp_disk_file.field_2;
        temp_disk_file._M_string_length = 0;
        temp_disk_file.field_2._M_local_buf[0] = '\0';
        this_00 = local_b8;
        bVar3 = ApplyMapping(local_b8,(string *)((long)pMVar1 + lVar8 + -0x20),
                             (string *)((long)&(pMVar1->virtual_path)._M_dataplus._M_p + lVar8),
                             &temp_disk_file);
        bVar2 = true;
        if (bVar3) {
          pZVar4 = OpenDiskFile((DiskSourceTree *)this_00,&temp_disk_file);
          if (pZVar4 == (ZeroCopyInputStream *)0x0) {
            piVar5 = __errno_location();
            if (*piVar5 == 0xd) {
              internal::LogMessage::LogMessage
                        (&local_88,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/importer.cc"
                         ,0x1b1);
              pLVar6 = internal::LogMessage::operator<<
                                 (&local_88,"Read access is denied for file: ");
              pLVar6 = internal::LogMessage::operator<<(pLVar6,&temp_disk_file);
              internal::LogFinisher::operator=(&local_c9,pLVar6);
              internal::LogMessage::~LogMessage(&local_88);
              bVar2 = false;
              local_c8 = (ZeroCopyInputStream *)0x0;
            }
          }
          else {
            if (local_c0 != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)local_c0);
            }
            bVar2 = false;
            local_c8 = pZVar4;
          }
        }
        lVar8 = lVar8 + 0x40;
        std::__cxx11::string::~string((string *)&temp_disk_file);
        if (!bVar2) {
          return local_c8;
        }
      }
    }
  }
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const string& virtual_file,
    string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    return NULL;
  }

  for (int i = 0; i < mappings_.size(); i++) {
    string temp_disk_file;
    if (ApplyMapping(virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        // TODO(kenton):  Find a way to report this more nicely.
        GOOGLE_LOG(WARNING) << "Read access is denied for file: " << temp_disk_file;
        return NULL;
      }
    }
  }

  return NULL;
}